

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmdisubwindow.cpp
# Opt level: O1

void QMdiSubWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  undefined4 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    local_4c = *_a[1];
    local_50 = *_a[2];
    puStack_40 = &local_4c;
    local_38 = &local_50;
    ppvVar3 = &local_48;
    local_48 = (void *)0x0;
    iVar5 = 0;
    goto LAB_0045ad1f;
  case 1:
    iVar5 = 1;
    ppvVar3 = (void **)0x0;
LAB_0045ad1f:
    QMetaObject::activate(_o,&staticMetaObject,iVar5,ppvVar3);
    break;
  case 2:
    showSystemMenu((QMdiSubWindow *)_o);
    break;
  case 3:
    showShaded((QMdiSubWindow *)_o);
    break;
  case 4:
    QMdiSubWindowPrivate::_q_updateStaysOnTopHint(*(QMdiSubWindowPrivate **)(_o + 8));
    break;
  case 5:
    QMdiSubWindowPrivate::_q_enterInteractiveMode(*(QMdiSubWindowPrivate **)(_o + 8));
    break;
  case 6:
    QMdiSubWindowPrivate::_q_processFocusChanged
              (*(QMdiSubWindowPrivate **)(_o + 8),(QWidget *)CONCAT44(in_register_00000034,_c),
               *_a[2]);
  }
  switch(_c) {
  case ReadProperty:
switchD_0045ac8a_caseD_1:
    if (_id == 1) {
      lVar4 = 0x2e4;
LAB_0045ae00:
      *(undefined4 *)*_a = *(undefined4 *)(lVar4 + *(long *)(_o + 8));
    }
    else if (_id == 0) {
      lVar4 = 0x2e0;
      goto LAB_0045ae00;
    }
    if (_c != WriteProperty) goto switchD_0045ac8a_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0045ac8a_caseD_3;
  case IndexOfMethod:
switchD_0045ac8a_caseD_5:
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == windowStateChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0045ac8a_caseD_3;
    }
    if (((code *)*plVar1 == aboutToActivate) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_0045ac8a_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0045ac8a_caseD_3;
      goto switchD_0045ac8a_caseD_1;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 6) {
      puVar2 = (undefined8 *)*_a;
      if (1 < *_a[1]) goto LAB_0045ad7f;
      *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
    }
    else {
      puVar2 = (undefined8 *)*_a;
LAB_0045ad7f:
      *puVar2 = 0;
    }
    if (_c == ReadProperty) goto switchD_0045ac8a_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0045ac8a_caseD_3;
      goto switchD_0045ac8a_caseD_5;
    }
  }
  if (_id == 1) {
    *(undefined4 *)(*(long *)(_o + 8) + 0x2e4) = **_a;
  }
  else if (_id == 0) {
    *(undefined4 *)(*(long *)(_o + 8) + 0x2e0) = **_a;
  }
switchD_0045ac8a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QMdiSubWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->windowStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::WindowStates>>(_a[2]))); break;
        case 1: _t->aboutToActivate(); break;
        case 2: _t->showSystemMenu(); break;
        case 3: _t->showShaded(); break;
        case 4: _t->d_func()->_q_updateStaysOnTopHint(); break;
        case 5: _t->d_func()->_q_enterInteractiveMode(); break;
        case 6: _t->d_func()->_q_processFocusChanged((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)(Qt::WindowStates , Qt::WindowStates )>(_a, &QMdiSubWindow::windowStateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QMdiSubWindow::*)()>(_a, &QMdiSubWindow::aboutToActivate, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->keyboardSingleStep(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->keyboardPageStep(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeyboardSingleStep(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setKeyboardPageStep(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}